

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

bool __thiscall cmQtAutoGeneratorMocUic::JobUicT::UpdateRequired(JobUicT *this,WorkerT *wrk)

{
  bool bVar1;
  cmQtAutoGeneratorMocUic *this_00;
  Logger *this_01;
  FileSystem *pFVar2;
  UicSettingsT *pUVar3;
  ulong uVar4;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  undefined1 local_158 [8];
  string reason_2;
  undefined1 local_130 [8];
  string error;
  undefined1 local_108 [7];
  bool isOlder;
  string local_e8;
  allocator<char> local_c1;
  undefined1 local_c0 [8];
  string reason_1;
  string local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string reason;
  bool verbose;
  WorkerT *wrk_local;
  JobUicT *this_local;
  
  this_00 = WorkerT::Gen(wrk);
  this_01 = cmQtAutoGenerator::Log(&this_00->super_cmQtAutoGenerator);
  reason.field_2._M_local_buf[0xf] = cmQtAutoGenerator::Logger::Verbose(this_01);
  pFVar2 = WorkerT::FileSys(wrk);
  bVar1 = cmQtAutoGenerator::FileSystem::FileExists(pFVar2,&this->BuildFile);
  if (bVar1) {
    pUVar3 = WorkerT::Uic(wrk);
    if ((pUVar3->SettingsChanged & 1U) == 0) {
      error.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::string::string((string *)local_130);
      pFVar2 = WorkerT::FileSys(wrk);
      error.field_2._M_local_buf[0xf] =
           cmQtAutoGenerator::FileSystem::FileIsOlderThan
                     (pFVar2,&this->BuildFile,&this->SourceFile,(string *)local_130);
      if (((bool)error.field_2._M_local_buf[0xf]) ||
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
        reason_2.field_2._12_4_ = 0;
      }
      else {
        WorkerT::LogError(wrk,UIC,(string *)local_130);
        this_local._7_1_ = 0;
        reason_2.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_130);
      if (reason_2.field_2._12_4_ == 0) {
        if ((error.field_2._M_local_buf[0xf] & 1U) == 0) {
          this_local._7_1_ = 0;
        }
        else {
          if ((reason.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_158,"Generating ",&local_159);
            std::allocator<char>::~allocator(&local_159);
            cmQtAutoGen::Quoted(&local_180,&this->BuildFile);
            std::__cxx11::string::operator+=((string *)local_158,(string *)&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::operator+=
                      ((string *)local_158," because it\'s older than its source file ");
            cmQtAutoGen::Quoted(&local_1a0,&this->SourceFile);
            std::__cxx11::string::operator+=((string *)local_158,(string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            WorkerT::LogInfo(wrk,UIC,(string *)local_158);
            std::__cxx11::string::~string((string *)local_158);
          }
          this_local._7_1_ = 1;
        }
      }
    }
    else {
      if ((reason.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c0,"Generating ",&local_c1);
        std::allocator<char>::~allocator(&local_c1);
        cmQtAutoGen::Quoted(&local_e8,&this->BuildFile);
        std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::operator+=((string *)local_c0," from ");
        cmQtAutoGen::Quoted((string *)local_108,&this->SourceFile);
        std::__cxx11::string::operator+=((string *)local_c0,(string *)local_108);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::operator+=((string *)local_c0," because the UIC settings changed");
        WorkerT::LogInfo(wrk,UIC,(string *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
      }
      this_local._7_1_ = 1;
    }
  }
  else {
    if ((reason.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"Generating ",&local_49)
      ;
      std::allocator<char>::~allocator(&local_49);
      cmQtAutoGen::Quoted(&local_80,&this->BuildFile);
      std::__cxx11::string::operator+=((string *)local_48,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::operator+=((string *)local_48," from its source file ");
      cmQtAutoGen::Quoted((string *)((long)&reason_1.field_2 + 8),&this->SourceFile);
      std::__cxx11::string::operator+=
                ((string *)local_48,(string *)(reason_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(reason_1.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_48," because it doesn\'t exist");
      WorkerT::LogInfo(wrk,UIC,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobUicT::UpdateRequired(WorkerT& wrk)
{
  bool const verbose = wrk.Gen().Log().Verbose();

  // Test if the build file exists
  if (!wrk.FileSys().FileExists(BuildFile)) {
    if (verbose) {
      std::string reason = "Generating ";
      reason += Quoted(BuildFile);
      reason += " from its source file ";
      reason += Quoted(SourceFile);
      reason += " because it doesn't exist";
      wrk.LogInfo(GenT::UIC, reason);
    }
    return true;
  }

  // Test if the uic settings changed
  if (wrk.Uic().SettingsChanged) {
    if (verbose) {
      std::string reason = "Generating ";
      reason += Quoted(BuildFile);
      reason += " from ";
      reason += Quoted(SourceFile);
      reason += " because the UIC settings changed";
      wrk.LogInfo(GenT::UIC, reason);
    }
    return true;
  }

  // Test if the source file is newer
  {
    bool isOlder = false;
    {
      std::string error;
      isOlder = wrk.FileSys().FileIsOlderThan(BuildFile, SourceFile, &error);
      if (!isOlder && !error.empty()) {
        wrk.LogError(GenT::UIC, error);
        return false;
      }
    }
    if (isOlder) {
      if (verbose) {
        std::string reason = "Generating ";
        reason += Quoted(BuildFile);
        reason += " because it's older than its source file ";
        reason += Quoted(SourceFile);
        wrk.LogInfo(GenT::UIC, reason);
      }
      return true;
    }
  }

  return false;
}